

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenerateDeterministicKey.cpp
# Opt level: O0

Blob * jbcoin::generatePublicDeterministicKey(Blob *__return_storage_ptr__,Blob *pubGen,int seq)

{
  ec_point local_58;
  ec_point newPoint;
  bignum hash;
  bn_ctx ctx;
  bignum local_30;
  ec_point local_28;
  ec_point rootPubKey;
  int seq_local;
  Blob *pubGen_local;
  
  rootPubKey.ptr._4_4_ = seq;
  openssl::bignum::bignum<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            (&local_30,pubGen);
  generateRootPubKey((jbcoin *)&local_28,&local_30);
  openssl::bignum::~bignum(&local_30);
  openssl::bn_ctx::bn_ctx((bn_ctx *)&hash);
  makeHash((jbcoin *)&newPoint,pubGen,rootPubKey.ptr._4_4_,(bignum *)&DAT_00527e10);
  openssl::multiply((openssl *)&local_58,openssl::secp256k1curve,(bignum *)&newPoint,(bn_ctx *)&hash
                   );
  openssl::add_to(openssl::secp256k1curve,&local_28,&local_58,(bn_ctx *)&hash);
  serialize_ec_point(__return_storage_ptr__,&local_58);
  openssl::ec_point::~ec_point(&local_58);
  openssl::bignum::~bignum((bignum *)&newPoint);
  openssl::bn_ctx::~bn_ctx((bn_ctx *)&hash);
  openssl::ec_point::~ec_point(&local_28);
  return __return_storage_ptr__;
}

Assistant:

Blob generatePublicDeterministicKey (Blob const& pubGen, int seq)
{
    // publicKey(n) = rootPublicKey EC_POINT_+ Hash(pubHash|seq)*point
    ec_point rootPubKey = generateRootPubKey (bignum (pubGen));

    bn_ctx ctx;

    // Calculate the private additional key.
    bignum hash = makeHash (pubGen, seq, secp256k1curve.order);

    // Calculate the corresponding public key.
    ec_point newPoint = multiply (secp256k1curve.group, hash, ctx);

    // Add the master public key and set.
    add_to (secp256k1curve.group, rootPubKey, newPoint, ctx);

    return serialize_ec_point (newPoint);
}